

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::TestFactoryImpl<PretransformVerticesTest_testProcessKeepHierarchy_Test>::
CreateTest(TestFactoryImpl<PretransformVerticesTest_testProcessKeepHierarchy_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x20);
  PretransformVerticesTest_testProcessKeepHierarchy_Test::
  PretransformVerticesTest_testProcessKeepHierarchy_Test
            ((PretransformVerticesTest_testProcessKeepHierarchy_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }